

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void slang::ast::ElabSystemTaskSymbol::reportStaticAssert
               (Scope *scope,SourceLocation loc,string_view message,Expression *condition)

{
  bool bVar1;
  Diagnostic *this;
  BinaryExpression *in_RDI;
  Diagnostic *in_R8;
  Scope *in_stack_00000010;
  SourceLocation in_stack_00000018;
  DiagCode in_stack_00000024;
  Diagnostic *diag;
  string *in_stack_ffffffffffffff68;
  Diagnostic *in_stack_ffffffffffffff70;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  if (((in_R8 == (Diagnostic *)0x0) ||
      ((in_R8->args).
       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0)) ||
     (bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_ffffffffffffff70), !bVar1)) {
    Scope::addDiag(in_stack_00000010,in_stack_00000024,in_stack_00000018);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    this = Diagnostic::addStringAllowEmpty(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
    std::allocator<char>::~allocator(&local_61);
    if ((in_R8 != (Diagnostic *)0x0) &&
       (*(ExpressionKind *)
         &(in_R8->args).
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == BinaryOp)) {
      Expression::as<slang::ast::BinaryExpression>((Expression *)in_R8);
      reduceComparison(in_RDI,in_R8);
    }
  }
  return;
}

Assistant:

void ElabSystemTaskSymbol::reportStaticAssert(const Scope& scope, SourceLocation loc,
                                              std::string_view message,
                                              const Expression* condition) {
    if (condition && condition->constant) {
        // Issue no diagnostic if the assert condition is true.
        if (condition->constant->isTrue())
            return;
    }

    auto& diag = scope.addDiag(diag::StaticAssert, loc).addStringAllowEmpty(std::string(message));

    // If the condition is a comparison operator, note the value of both
    // sides to provide more info about why the assertion failed.
    if (condition && condition->kind == ExpressionKind::BinaryOp)
        reduceComparison(condition->as<BinaryExpression>(), diag);
}